

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O0

void __thiscall
jaegertracing::thrift::DependencyConcurrentClient::send_saveDependencies
          (DependencyConcurrentClient *this,Dependencies *dependencies)

{
  TProtocol *this_00;
  element_type *peVar1;
  void *__buf;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  Dependency_saveDependencies_pargs args;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  TConcurrentSendSentry sentry;
  int32_t cseqid;
  Dependencies *dependencies_local;
  DependencyConcurrentClient *this_local;
  
  sentry._12_4_ = 0;
  apache::thrift::async::TConcurrentSendSentry::TConcurrentSendSentry
            ((TConcurrentSendSentry *)local_30,&this->sync_);
  this_00 = this->oprot_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"saveDependencies",&local_51);
  apache::thrift::protocol::TProtocol::writeMessageBegin(this_00,&local_50,T_ONEWAY,sentry._12_4_);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  Dependency_saveDependencies_pargs::Dependency_saveDependencies_pargs
            ((Dependency_saveDependencies_pargs *)(local_88 + 0x10));
  args._vptr_Dependency_saveDependencies_pargs = (_func_int **)dependencies;
  Dependency_saveDependencies_pargs::write
            ((Dependency_saveDependencies_pargs *)(local_88 + 0x10),(int)this->oprot_,__buf,
             (size_t)dependencies);
  apache::thrift::protocol::TProtocol::writeMessageEnd(this->oprot_);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_88);
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
  (*peVar1->_vptr_TTransport[10])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_88);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_98);
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
  (*peVar1->_vptr_TTransport[0xb])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_98);
  apache::thrift::async::TConcurrentSendSentry::commit((TConcurrentSendSentry *)local_30);
  Dependency_saveDependencies_pargs::~Dependency_saveDependencies_pargs
            ((Dependency_saveDependencies_pargs *)(local_88 + 0x10));
  apache::thrift::async::TConcurrentSendSentry::~TConcurrentSendSentry
            ((TConcurrentSendSentry *)local_30);
  return;
}

Assistant:

void DependencyConcurrentClient::send_saveDependencies(const Dependencies& dependencies)
{
  int32_t cseqid = 0;
  ::apache::thrift::async::TConcurrentSendSentry sentry(&this->sync_);
  oprot_->writeMessageBegin("saveDependencies", ::apache::thrift::protocol::T_ONEWAY, cseqid);

  Dependency_saveDependencies_pargs args;
  args.dependencies = &dependencies;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();

  sentry.commit();
}